

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP.cpp
# Opt level: O3

bool __thiscall SRUP_MSG::senderID(SRUP_MSG *this,uint64_t *sender)

{
  uint64_t *puVar1;
  
  if (this->m_sender_ID != (uint64_t *)0x0) {
    operator_delete(this->m_sender_ID);
  }
  puVar1 = (uint64_t *)operator_new(8);
  this->m_sender_ID = puVar1;
  *puVar1 = *sender;
  return true;
}

Assistant:

bool SRUP_MSG::senderID(const uint64_t *sender)
{
    try
    {
        if (m_sender_ID != nullptr)
            delete(m_sender_ID);

        m_sender_ID = new uint64_t;
        std::memcpy(m_sender_ID, sender, sizeof(*sender));
    }
    catch (...)
    {
        m_sender_ID = nullptr;
        return false;
    }
    return true;
}